

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

void __thiscall Character::Unhide(Character *this,int unsetflags)

{
  uint uVar1;
  list<Character_*,_std::allocator<Character_*>_> *plVar2;
  _List_node_base *p_Var3;
  PacketBuilder builder;
  PacketBuilder PStack_48;
  
  uVar1 = this->hidden;
  this->hidden = ~unsetflags & uVar1;
  if ((unsetflags & uVar1 & 1) != 0) {
    PacketBuilder::PacketBuilder(&PStack_48,PACKET_ADMININTERACT,PACKET_AGREE,2);
    PacketBuilder::AddShort(&PStack_48,this->player->id);
    plVar2 = &this->map->characters;
    p_Var3 = (_List_node_base *)plVar2;
    while (p_Var3 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var3->_M_next)->
                    _M_impl)._M_node.super__List_node_base._M_next,
          p_Var3 != (_List_node_base *)plVar2) {
      Player::Send(*(Player **)((long)p_Var3[1]._M_next + 0x418),&PStack_48);
    }
    PacketBuilder::~PacketBuilder(&PStack_48);
  }
  return;
}

Assistant:

void Character::Unhide(int unsetflags)
{
	bool washidden = this->hidden & HideInvisible;
	this->hidden &= ~unsetflags;

	if (washidden && (unsetflags & HideInvisible))
	{
		PacketBuilder builder(PACKET_ADMININTERACT, PACKET_AGREE, 2);
		builder.AddShort(this->PlayerID());

		UTIL_FOREACH(this->map->characters, character)
		{
			character->Send(builder);
		}
	}
}